

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdGenRandPerm(int *pPerm,int nVars)

{
  int iVar1;
  int iVar2;
  int t;
  int vNew;
  int v;
  int nVars_local;
  int *pPerm_local;
  
  for (t = 0; t < nVars; t = t + 1) {
    pPerm[t] = t;
  }
  for (t = 0; t < nVars; t = t + 1) {
    iVar2 = rand();
    iVar1 = pPerm[t];
    pPerm[t] = pPerm[iVar2 % nVars];
    pPerm[iVar2 % nVars] = iVar1;
  }
  return;
}

Assistant:

void Dau_DsdGenRandPerm( int * pPerm, int nVars )
{
    int v, vNew;
    for ( v = 0; v < nVars; v++ )
        pPerm[v] = v;
    for ( v = 0; v < nVars; v++ )
    {
        vNew = rand() % nVars;
        ABC_SWAP( int, pPerm[v], pPerm[vNew] );
    }
}